

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::confirm::~confirm(confirm *this)

{
  ostream *poVar1;
  allocator local_112;
  allocator local_111;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  text local_b0;
  string local_90 [32];
  text local_70;
  string local_50 [32];
  text local_30;
  
  if (this->failures < 1) {
    if ((this->output).opt.pass == true) {
      poVar1 = std::operator<<((this->super_action).os,"All ");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->selected);
      poVar1 = std::operator<<(poVar1," selected ");
      std::__cxx11::string::string(local_d0,"test",&local_111);
      std::__cxx11::string::string((string *)&local_70,local_d0);
      pluralise(&local_b0,&local_70,this->selected);
      poVar1 = std::operator<<(poVar1,(string *)&local_b0);
      poVar1 = std::operator<<(poVar1," ");
      std::__cxx11::string::string(local_110,"passed.\n",&local_112);
      std::__cxx11::string::string(local_90,local_110);
      std::__cxx11::string::string(local_f0,local_90);
      std::operator<<(poVar1,local_f0);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->failures);
    poVar1 = std::operator<<(poVar1," out of ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->selected);
    poVar1 = std::operator<<(poVar1," selected ");
    std::__cxx11::string::string(local_d0,"test",&local_111);
    std::__cxx11::string::string((string *)&local_30,local_d0);
    pluralise(&local_b0,&local_30,this->selected);
    poVar1 = std::operator<<(poVar1,(string *)&local_b0);
    poVar1 = std::operator<<(poVar1," ");
    std::__cxx11::string::string(local_110,"failed.\n",&local_112);
    std::__cxx11::string::string(local_50,local_110);
    std::__cxx11::string::string(local_f0,local_50);
    std::operator<<(poVar1,local_f0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  env::~env(&this->output);
  return;
}

Assistant:

~confirm()
    {
        if ( failures > 0 )
        {
            os << failures << " out of " << selected << " selected " << pluralise("test", selected) << " " << colourise( "failed.\n" );
        }
        else if ( output.pass() )
        {
            os << "All " << selected << " selected " << pluralise("test", selected) << " " << colourise( "passed.\n" );
        }
    }